

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O2

ssize_t __thiscall
udpdiscovery::impl::PeerEnv::send(PeerEnv *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  ssize_t sVar4;
  sockaddr_in addr;
  string packet_data;
  string user_data;
  Packet packet;
  
  if (__fd == 0) {
    pthread_mutex_lock((pthread_mutex_t *)&this->lock_);
    std::__cxx11::string::string((string *)&user_data,(string *)&this->user_data_);
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
  }
  else {
    std::__cxx11::string::string((string *)&user_data,(string *)&this->user_data_);
  }
  packet.user_data_._M_dataplus._M_p = (pointer)&packet.user_data_.field_2;
  packet.user_data_._M_string_length = 0;
  packet.user_data_.field_2._M_local_buf[0] = '\0';
  packet.application_id_ = (this->parameters_).application_id_;
  packet.peer_id_ = this->peer_id_;
  packet.snapshot_index_ = this->packet_index_;
  packet.packet_type_ = (uint8_t)__n;
  std::__cxx11::string::swap((string *)&packet.user_data_);
  this->packet_index_ = this->packet_index_ + 1;
  packet_data._M_dataplus._M_p = (pointer)&packet_data.field_2;
  packet_data._M_string_length = 0;
  packet_data.field_2._M_local_buf[0] = '\0';
  bVar3 = Packet::Serialize(&packet,(ProtocolVersion)__buf,&packet_data);
  if (bVar3) {
    addr.sin_family = 0;
    addr.sin_port = 0;
    addr.sin_addr.s_addr = 0;
    addr.sin_zero[0] = '\0';
    addr.sin_zero[1] = '\0';
    addr.sin_zero[2] = '\0';
    addr.sin_zero[3] = '\0';
    addr.sin_zero[4] = '\0';
    addr.sin_zero[5] = '\0';
    addr.sin_zero[6] = '\0';
    addr.sin_zero[7] = '\0';
    if ((this->parameters_).can_use_broadcast_ == true) {
      uVar1 = (ushort)(this->parameters_).port_;
      addr.sin_port = uVar1 << 8 | uVar1 >> 8;
      addr.sin_family = 2;
      addr.sin_addr.s_addr = 0xffffffff;
    }
    if ((this->parameters_).can_use_multicast_ == true) {
      uVar1 = (ushort)(this->parameters_).port_;
      addr.sin_port = uVar1 << 8 | uVar1 >> 8;
      addr.sin_family = 2;
      uVar2 = (this->parameters_).multicast_group_address_;
      addr.sin_addr.s_addr =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    }
    sendto(this->sock_,packet_data._M_dataplus._M_p,packet_data._M_string_length,0,(sockaddr *)&addr
           ,0x10);
  }
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  sVar4 = std::__cxx11::string::_M_dispose();
  return sVar4;
}

Assistant:

void send(bool under_lock, ProtocolVersion protocol_version,
            PacketType packet_type) {
    if (!under_lock) {
      lock_.Lock();
    }
    std::string user_data = user_data_;
    if (!under_lock) {
      lock_.Unlock();
    }

    Packet packet;
    packet.set_packet_type(packet_type);
    packet.set_application_id(parameters_.application_id());
    packet.set_peer_id(peer_id_);
    packet.set_snapshot_index(packet_index_);
    packet.SwapUserData(user_data);

    ++packet_index_;

    std::string packet_data;
    if (!packet.Serialize(protocol_version, packet_data)) {
      return;
    }

    sockaddr_in addr;
    memset((char*)&addr, 0, sizeof(sockaddr_in));

    if (parameters_.can_use_broadcast()) {
      addr.sin_family = AF_INET;
      addr.sin_port = htons(parameters_.port());
      addr.sin_addr.s_addr = htonl(INADDR_BROADCAST);
    }

    if (parameters_.can_use_multicast()) {
      addr.sin_family = AF_INET;
      addr.sin_port = htons(parameters_.port());
      addr.sin_addr.s_addr = htonl(parameters_.multicast_group_address());
    }

    sendto(sock_, packet_data.data(), packet_data.size(), 0,
           (struct sockaddr*)&addr, sizeof(sockaddr_in));
  }